

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O2

void __thiscall duckdb::ArrowArrayScanState::Reset(ArrowArrayScanState *this)

{
  pointer this_00;
  __node_base *p_Var1;
  
  ArrowRunEndEncodingState::Reset(&this->run_end_encoding);
  p_Var1 = &(this->children)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_00 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
              ::operator->((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                            *)(p_Var1 + 2));
    Reset(this_00);
  }
  ::std::__shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2> *)
             &this->owned_data);
  return;
}

Assistant:

void Reset() {
		// Note: dictionary is not reset
		// the dictionary should be the same for every array scanned of this column
		run_end_encoding.Reset();
		for (auto &child : children) {
			child.second->Reset();
		}
		owned_data.reset();
	}